

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  MemoryManagerImpl *this;
  XMLGrammarPoolImpl *this_00;
  ThreadParser *this_01;
  ulong uVar6;
  ulong uVar7;
  ThreadInfo *pTVar8;
  long lVar9;
  long lVar10;
  ThreadInfo *local_b0;
  double parsesPerMinute;
  double totalParsesCompleted;
  char c;
  int elapsedSeconds;
  unsigned_long startTime;
  bool notDone;
  int threadNum;
  char *fileName;
  int cksum;
  bool errors;
  int n_1;
  ThreadParser *mainParser;
  int n;
  char **argv_local;
  int argc_local;
  
  parseCommandLine(argc,argv);
  uVar6 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if ((((gRunInfo.doSchema & 1U) == 1) && ((gRunInfo.doNamespaces & 1U) == 1)) &&
     ((gRunInfo.doGrammarCaching & 1U) == 1)) {
    this = (MemoryManagerImpl *)operator_new(8);
    xercesc_4_0::MemoryManagerImpl::MemoryManagerImpl(this);
    gpMemMgr = (MemoryManager *)this;
    this_00 = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar6);
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(this_00,gpMemMgr);
    gRunInfo.doInitialParse = true;
    gp = (XMLGrammarPool *)this_00;
  }
  ReadFilesIntoMemory();
  for (mainParser._0_4_ = 0; (int)mainParser < gRunInfo.numInputFiles;
      mainParser._0_4_ = (int)mainParser + 1) {
    gRunInfo.files[(int)mainParser].checkSum = 0;
  }
  if ((gRunInfo.doInitialParse & 1U) != 0) {
    this_01 = (ThreadParser *)operator_new(0x40);
    ThreadParser::ThreadParser(this_01);
    bVar4 = false;
    for (cksum = 0; cksum < gRunInfo.numInputFiles; cksum = cksum + 1) {
      pcVar1 = gRunInfo.files[cksum].fileName;
      if ((gRunInfo.verbose & 1U) != 0) {
        printf("%s checksum is ",pcVar1);
      }
      uVar5 = ThreadParser::parse(this_01,cksum);
      if (uVar5 == 0) {
        fprintf(_stderr,"An error occurred while initially parsing %s\n",pcVar1);
        bVar4 = true;
      }
      gRunInfo.files[cksum].checkSum = uVar5;
      if ((gRunInfo.verbose & 1U) != 0) {
        printf("%x\n",(ulong)uVar5);
      }
      if ((((gRunInfo.dumpOnErr & 1U) != 0) && (bVar4)) && ((gRunInfo.dom & 1U) != 0)) {
        ThreadParser::domPrint(this_01);
      }
    }
    if (this_01 != (ThreadParser *)0x0) {
      ThreadParser::~ThreadParser(this_01);
      operator_delete(this_01,0x40);
    }
    if (bVar4) {
      fprintf(_stderr,"Quitting due to error incurred during initial parse\n");
      clearFileInfoMemory();
      return 1;
    }
  }
  if (gRunInfo.numThreads == 0) {
    clearFileInfoMemory();
    exit(0);
  }
  uVar6 = (ulong)gRunInfo.numThreads;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  uVar7 = SUB168(auVar3 * ZEXT816(0xc),0);
  if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pTVar8 = (ThreadInfo *)operator_new__(uVar7);
  if (uVar6 != 0) {
    local_b0 = pTVar8;
    do {
      ThreadInfo::ThreadInfo(local_b0);
      local_b0 = local_b0 + 1;
    } while (local_b0 != pTVar8 + uVar6);
  }
  gThreadInfo = pTVar8;
  for (startTime._4_4_ = 0; (int)startTime._4_4_ < gRunInfo.numThreads;
      startTime._4_4_ = startTime._4_4_ + 1) {
    gThreadInfo[(int)startTime._4_4_].fThreadNum = startTime._4_4_;
    ThreadFuncs::startThread(threadMain,gThreadInfo + (int)startTime._4_4_);
  }
  if (gRunInfo.numParses == 0) {
    lVar9 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    totalParsesCompleted._4_4_ = 0;
    while (gRunInfo.totalTime == 0 || totalParsesCompleted._4_4_ < gRunInfo.totalTime) {
      ThreadFuncs::Sleep(1000);
      if (((gRunInfo.quiet & 1U) == 0) && ((gRunInfo.verbose & 1U) == 0)) {
        totalParsesCompleted._3_1_ = '+';
        for (startTime._4_4_ = 0; (int)startTime._4_4_ < gRunInfo.numThreads;
            startTime._4_4_ = startTime._4_4_ + 1) {
          if ((gThreadInfo[(int)startTime._4_4_].fHeartBeat & 1U) == 0) {
            totalParsesCompleted._3_1_ = '.';
            break;
          }
        }
        fputc((int)totalParsesCompleted._3_1_,_stdout);
        fflush(_stdout);
        if (totalParsesCompleted._3_1_ == '+') {
          for (startTime._4_4_ = 0; (int)startTime._4_4_ < gRunInfo.numThreads;
              startTime._4_4_ = startTime._4_4_ + 1) {
            gThreadInfo[(int)startTime._4_4_].fHeartBeat = false;
          }
        }
      }
      lVar10 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      auVar2._8_8_ = 0;
      auVar2._0_8_ = lVar10 - lVar9;
      totalParsesCompleted._4_4_ = SUB164(auVar2 / ZEXT816(1000),0);
    }
  }
  else {
    do {
      ThreadFuncs::Sleep(1000);
      bVar4 = false;
      for (startTime._4_4_ = 0; (int)startTime._4_4_ < gRunInfo.numThreads;
          startTime._4_4_ = startTime._4_4_ + 1) {
        if (gThreadInfo[(int)startTime._4_4_].fParses < gRunInfo.numParses) {
          bVar4 = true;
        }
      }
    } while (bVar4);
  }
  gRunInfo.stopNow = true;
  for (startTime._4_4_ = 0; (int)startTime._4_4_ < gRunInfo.numThreads;
      startTime._4_4_ = startTime._4_4_ + 1) {
    while ((gThreadInfo[(int)startTime._4_4_].fInProgress & 1U) == 1) {
      ThreadFuncs::Sleep(1000);
    }
    if ((gRunInfo.verbose & 1U) != 0) {
      printf("Thread #%d: is finished.\n",(ulong)startTime._4_4_);
    }
  }
  parsesPerMinute = 0.0;
  for (startTime._4_4_ = 0; (int)startTime._4_4_ < gRunInfo.numThreads;
      startTime._4_4_ = startTime._4_4_ + 1) {
    parsesPerMinute = (double)gThreadInfo[(int)startTime._4_4_].fParses + parsesPerMinute;
  }
  if ((gRunInfo.quiet & 1U) == 0) {
    if (gRunInfo.numParses == 0) {
      printf("\n%8.2f parses per minute.\n",parsesPerMinute / ((double)gRunInfo.totalTime / 60.0));
    }
    else {
      printf("\n%8.0f total parses were completed.\n",parsesPerMinute);
    }
  }
  if (gp != (XMLGrammarPool *)0x0) {
    if (gp != (XMLGrammarPool *)0x0) {
      (**(code **)(*(long *)gp + 8))();
    }
    if (gpMemMgr != (MemoryManager *)0x0) {
      (*gpMemMgr->_vptr_MemoryManager[1])();
    }
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  clearFileInfoMemory();
  if (gThreadInfo != (ThreadInfo *)0x0) {
    operator_delete__(gThreadInfo);
  }
  printf("Test Run Successfully\n");
  return 0;
}

Assistant:

int main (int argc, char **argv)
{


    parseCommandLine(argc, argv);

    //
    // Initialize the XML system.
    //
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (...)
    {
        fprintf(stderr, "Exception from XMLPlatfromUtils::Initialize.\n");
        return 1;
    }


    /** Grammar caching thread testing */
    // Initialize memory manger and grammar pool
    // set doInitialParse to true so that the first parse will cache the
    // grammar and it'll be used in subsequent parses

    if (gRunInfo.doSchema == true && gRunInfo.doNamespaces == true && gRunInfo.doGrammarCaching == true) {
        gpMemMgr = new MemoryManagerImpl();
        gp = new XMLGrammarPoolImpl(gpMemMgr);
        gRunInfo.doInitialParse = true;
    }

    //
    // If we will be parsing from memory, read each of the input files
    //  into memory now.
    //
    ReadFilesIntoMemory();

    // Initialize checksums to zero so we can check first parse and if
    // zero then we need to move first parse's checksum into array. This
    // is for the cse where we skip the initial parse.
    for (int n = 0; n < gRunInfo.numInputFiles; n++)
    {
        gRunInfo.files[n].checkSum = 0;
    }

    if (gRunInfo.doInitialParse)
    {
    //
    // While we are still single threaded, parse each of the documents
    // once, to check for errors, and to note the checksum.
    // Blow off the rest of the test if there are errors.
    //
        ThreadParser *mainParser = new ThreadParser;
        int     n;
        bool    errors = false;
        int     cksum;

        for (n = 0; n < gRunInfo.numInputFiles; n++)
        {
            char *fileName = gRunInfo.files[n].fileName;
            if (gRunInfo.verbose)
                printf("%s checksum is ", fileName);

            cksum = mainParser->parse(n);

            if (cksum == 0) {
                fprintf(stderr, "An error occurred while initially parsing %s\n",
                    fileName);
                errors = true;
            };

            gRunInfo.files[n].checkSum = cksum;
            if (gRunInfo.verbose )
                printf("%x\n", cksum);
            if (gRunInfo.dumpOnErr && errors && gRunInfo.dom) {
                mainParser->domPrint();
            }

        }
        delete mainParser;

        if (errors) {
            fprintf(stderr, "Quitting due to error incurred during initial parse\n");
            clearFileInfoMemory();
            return 1;
        }
    }

    //
    //  Fire off the requested number of parallel threads
    //

    if (gRunInfo.numThreads == 0) {
        clearFileInfoMemory();
        exit(0);
    }

    gThreadInfo = new ThreadInfo[gRunInfo.numThreads];

    int threadNum;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        gThreadInfo[threadNum].fThreadNum = threadNum;
        ThreadFuncs::startThread(threadMain, &gThreadInfo[threadNum]);
    }

    if (gRunInfo.numParses)
    {
        bool notDone;
        while (true)
        {
            ThreadFuncs::Sleep(1000);
            notDone = false;

            for (threadNum = 0; threadNum < gRunInfo.numThreads; threadNum++) {
                if (gThreadInfo[threadNum].fParses < gRunInfo.numParses)
                    notDone = true;
            }
            if (notDone == false) {
                break;
            }
        }
    }
    else
    {
        //
        //  Loop, watching the heartbeat of the worker threads.
        //    Each second, display "+" when all threads have completed a parse
        //                 display "." if some thread hasn't since previous "+"
        //

        unsigned long startTime = XMLPlatformUtils::getCurrentMillis();
        int elapsedSeconds = 0;
        while (gRunInfo.totalTime == 0 || gRunInfo.totalTime > elapsedSeconds) {
            ThreadFuncs::Sleep(1000);
            if (gRunInfo.quiet == false && gRunInfo.verbose == false) {
                char c = '+';
                for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
                    if (gThreadInfo[threadNum].fHeartBeat == false) {
                        c = '.';
                        break;
                    }
                }
                fputc(c, stdout);
                fflush(stdout);
                if (c == '+')
                    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
                        gThreadInfo[threadNum].fHeartBeat = false;
            }
            elapsedSeconds = (XMLPlatformUtils::getCurrentMillis() - startTime) / 1000;
        }
    }

    //
    //  Time's up, we are done.  (We only get here if this was a timed run)
    //  Tally up the total number of parses completed by each of the threads.
    //
    gRunInfo.stopNow = true;      // set flag, which will cause worker threads to stop.

    //
    //  Make sure all threads are done before terminate
    //
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
        while (gThreadInfo[threadNum].fInProgress == true) {
            ThreadFuncs::Sleep(1000);
        }
        if (gRunInfo.verbose)
            printf("Thread #%d: is finished.\n", threadNum);
    }

    //
    //  We are done!   Count the number of parse and terminate the program
    //
    double totalParsesCompleted = 0;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        totalParsesCompleted += gThreadInfo[threadNum].fParses;
        // printf("%f   ", totalParsesCompleted);
    }

    if (gRunInfo.quiet == false) {
        if (gRunInfo.numParses) {
            printf("\n%8.0f total parses were completed.\n", totalParsesCompleted);
        }
        else {
            double parsesPerMinute = totalParsesCompleted / (double(gRunInfo.totalTime) / double(60));
            printf("\n%8.2f parses per minute.\n", parsesPerMinute);
        }
    }

    // delete grammar pool and memory manager
    if (gp) {
        delete gp;
        delete gpMemMgr;
    }

    XMLPlatformUtils::Terminate();

    clearFileInfoMemory();

    delete [] gThreadInfo;

    printf("Test Run Successfully\n");

    return 0;
}